

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaFreeValidCtxt(xmlSchemaValidCtxtPtr ctxt)

{
  xmlSchemaPSVIIDCNodePtr pxVar1;
  xmlSchemaIDCAugPtr pxVar2;
  xmlSchemaNodeInfoPtr ielem;
  xmlSchemaIDCAugPtr_conflict pxVar3;
  xmlSchemaNodeInfoPtr *ppxVar4;
  int i;
  long lVar5;
  int i_1;
  
  if (ctxt != (xmlSchemaValidCtxtPtr)0x0) {
    if (ctxt->value != (xmlSchemaValPtr)0x0) {
      xmlSchemaFreeValue(ctxt->value);
    }
    if (ctxt->pctxt != (xmlSchemaParserCtxtPtr)0x0) {
      xmlSchemaFreeParserCtxt(ctxt->pctxt);
    }
    if (ctxt->idcNodes != (xmlSchemaPSVIIDCNodePtr *)0x0) {
      for (lVar5 = 0; lVar5 < ctxt->nbIdcNodes; lVar5 = lVar5 + 1) {
        pxVar1 = ctxt->idcNodes[lVar5];
        (*xmlFree)(pxVar1->keys);
        (*xmlFree)(pxVar1);
      }
      (*xmlFree)(ctxt->idcNodes);
    }
    if (ctxt->idcKeys != (xmlSchemaPSVIIDCKeyPtr *)0x0) {
      for (lVar5 = 0; lVar5 < ctxt->nbIdcKeys; lVar5 = lVar5 + 1) {
        xmlSchemaIDCFreeKey(ctxt->idcKeys[lVar5]);
      }
      (*xmlFree)(ctxt->idcKeys);
    }
    if (ctxt->xpathStates != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
      xmlSchemaFreeIDCStateObjList(ctxt->xpathStates);
      ctxt->xpathStates = (xmlSchemaIDCStateObjPtr_conflict)0x0;
    }
    if (ctxt->xpathStatePool != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
      xmlSchemaFreeIDCStateObjList(ctxt->xpathStatePool);
      ctxt->xpathStatePool = (xmlSchemaIDCStateObjPtr_conflict)0x0;
    }
    pxVar3 = ctxt->aidcs;
    while (pxVar3 != (xmlSchemaIDCAugPtr_conflict)0x0) {
      pxVar2 = pxVar3->next;
      (*xmlFree)(pxVar3);
      pxVar3 = pxVar2;
    }
    if (ctxt->attrInfos != (xmlSchemaAttrInfoPtr *)0x0) {
      if (ctxt->nbAttrInfos != 0) {
        xmlSchemaClearAttrInfos(ctxt);
      }
      for (lVar5 = 0; lVar5 < ctxt->sizeAttrInfos; lVar5 = lVar5 + 1) {
        (*xmlFree)(ctxt->attrInfos[lVar5]);
      }
      (*xmlFree)(ctxt->attrInfos);
    }
    ppxVar4 = ctxt->elemInfos;
    if (ppxVar4 != (xmlSchemaNodeInfoPtr *)0x0) {
      lVar5 = 0;
      while ((lVar5 < ctxt->sizeElemInfos &&
             (ielem = ppxVar4[lVar5], ielem != (xmlSchemaNodeInfoPtr)0x0))) {
        xmlSchemaClearElemInfo(ctxt,ielem);
        (*xmlFree)(ielem);
        lVar5 = lVar5 + 1;
        ppxVar4 = ctxt->elemInfos;
      }
      (*xmlFree)(ppxVar4);
    }
    if (ctxt->nodeQNames != (xmlSchemaItemListPtr)0x0) {
      xmlSchemaItemListFree(ctxt->nodeQNames);
    }
    if (ctxt->dict != (xmlDictPtr)0x0) {
      xmlDictFree(ctxt->dict);
    }
    if (ctxt->filename != (char *)0x0) {
      (*xmlFree)(ctxt->filename);
    }
    (*xmlFree)(ctxt);
    return;
  }
  return;
}

Assistant:

void
xmlSchemaFreeValidCtxt(xmlSchemaValidCtxtPtr ctxt)
{
    if (ctxt == NULL)
        return;
    if (ctxt->value != NULL)
        xmlSchemaFreeValue(ctxt->value);
    if (ctxt->pctxt != NULL)
	xmlSchemaFreeParserCtxt(ctxt->pctxt);
    if (ctxt->idcNodes != NULL) {
	int i;
	xmlSchemaPSVIIDCNodePtr item;

	for (i = 0; i < ctxt->nbIdcNodes; i++) {
	    item = ctxt->idcNodes[i];
	    xmlFree(item->keys);
	    xmlFree(item);
	}
	xmlFree(ctxt->idcNodes);
    }
    if (ctxt->idcKeys != NULL) {
	int i;
	for (i = 0; i < ctxt->nbIdcKeys; i++)
	    xmlSchemaIDCFreeKey(ctxt->idcKeys[i]);
	xmlFree(ctxt->idcKeys);
    }

    if (ctxt->xpathStates != NULL) {
	xmlSchemaFreeIDCStateObjList(ctxt->xpathStates);
	ctxt->xpathStates = NULL;
    }
    if (ctxt->xpathStatePool != NULL) {
	xmlSchemaFreeIDCStateObjList(ctxt->xpathStatePool);
	ctxt->xpathStatePool = NULL;
    }

    /*
    * Augmented IDC information.
    */
    if (ctxt->aidcs != NULL) {
	xmlSchemaIDCAugPtr cur = ctxt->aidcs, next;
	do {
	    next = cur->next;
	    xmlFree(cur);
	    cur = next;
	} while (cur != NULL);
    }
    if (ctxt->attrInfos != NULL) {
	int i;
	xmlSchemaAttrInfoPtr attr;

	/* Just a paranoid call to the cleanup. */
	if (ctxt->nbAttrInfos != 0)
	    xmlSchemaClearAttrInfos(ctxt);
	for (i = 0; i < ctxt->sizeAttrInfos; i++) {
	    attr = ctxt->attrInfos[i];
	    xmlFree(attr);
	}
	xmlFree(ctxt->attrInfos);
    }
    if (ctxt->elemInfos != NULL) {
	int i;
	xmlSchemaNodeInfoPtr ei;

	for (i = 0; i < ctxt->sizeElemInfos; i++) {
	    ei = ctxt->elemInfos[i];
	    if (ei == NULL)
		break;
	    xmlSchemaClearElemInfo(ctxt, ei);
	    xmlFree(ei);
	}
	xmlFree(ctxt->elemInfos);
    }
    if (ctxt->nodeQNames != NULL)
	xmlSchemaItemListFree(ctxt->nodeQNames);
    if (ctxt->dict != NULL)
	xmlDictFree(ctxt->dict);
    if (ctxt->filename != NULL)
	xmlFree(ctxt->filename);
    xmlFree(ctxt);
}